

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utils.cpp
# Opt level: O0

ostream * wv::operator<<(ostream *os,sentence *sent)

{
  size_type sVar1;
  ostream *poVar2;
  const_reference pvVar3;
  ulong local_20;
  size_t i;
  sentence *sent_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(sent);
    if (sVar1 <= local_20) break;
    poVar2 = std::operator<<(os,"\'");
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](sent,local_20);
    poVar2 = std::operator<<(poVar2,(string *)pvVar3);
    std::operator<<(poVar2,"\'");
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(sent);
    if (local_20 != sVar1 - 1) {
      std::operator<<(os," ");
    }
    local_20 = local_20 + 1;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const sentence& sent) {
    os << "[";
    for(size_t i=0; i<sent.size(); ++i){
        os << "'" << sent[i] << "'";
        if(i != sent.size()-1)
            os << " ";
    }
    os << "]";
    return os;
}